

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Term_xtra_x11_react(void)

{
  void *pvVar1;
  uint32_t uVar2;
  ulong fg;
  term_data *td;
  wchar_t j_1;
  wchar_t j;
  Pixell pixel;
  XSetWindowAttributes xattr;
  wchar_t i;
  
  if (((byte)Metadpy->field_0x68 >> 1 & 1) != 0) {
    for (xattr.cursor._4_4_ = 0; xattr.cursor._4_4_ < 0x20;
        xattr.cursor._4_4_ = xattr.cursor._4_4_ + 1) {
      if ((((color_table_x11[xattr.cursor._4_4_][0] != angband_color_table[xattr.cursor._4_4_][0])
           || (color_table_x11[xattr.cursor._4_4_][1] != angband_color_table[xattr.cursor._4_4_][1])
           ) || (color_table_x11[xattr.cursor._4_4_][2] !=
                 angband_color_table[xattr.cursor._4_4_][2])) ||
         (color_table_x11[xattr.cursor._4_4_][3] != angband_color_table[xattr.cursor._4_4_][3])) {
        color_table_x11[xattr.cursor._4_4_][0] = angband_color_table[xattr.cursor._4_4_][0];
        color_table_x11[xattr.cursor._4_4_][1] = angband_color_table[xattr.cursor._4_4_][1];
        color_table_x11[xattr.cursor._4_4_][2] = angband_color_table[xattr.cursor._4_4_][2];
        color_table_x11[xattr.cursor._4_4_][3] = angband_color_table[xattr.cursor._4_4_][3];
        uVar2 = create_pixel(Metadpy->dpy,color_table_x11[xattr.cursor._4_4_][1],
                             color_table_x11[xattr.cursor._4_4_][2],
                             color_table_x11[xattr.cursor._4_4_][3]);
        fg = (ulong)uVar2;
        Infoclr = clr[xattr.cursor._4_4_];
        Infoclr_change_fg(fg);
        if (xattr.cursor._4_4_ == 0) {
          Metadpy->bg = fg;
          for (td._4_4_ = 0; td._4_4_ < 0x20; td._4_4_ = td._4_4_ + 1) {
            Infoclr = clr[td._4_4_];
            Infoclr_change_bg(fg);
          }
        }
        else if (xattr.cursor._4_4_ == 1) {
          Metadpy->fg = fg;
        }
        else if (xattr.cursor._4_4_ == 0x1c) {
          for (td._0_4_ = 0x40; (int)td < 0x60; td._0_4_ = (int)td + 1) {
            Infoclr = clr[(int)td];
            Infoclr_change_bg(fg);
          }
        }
        Infoclr = clr[xattr.cursor._4_4_ + 0x20];
        Infoclr_change_fg(fg);
        Infoclr_change_bg(fg);
        Infoclr = clr[xattr.cursor._4_4_ + 0x40];
        Infoclr_change_fg(fg);
      }
    }
    xattr.background_pixmap = Metadpy->bg;
    for (xattr.cursor._4_4_ = 0; xattr.cursor._4_4_ < 8; xattr.cursor._4_4_ = xattr.cursor._4_4_ + 1
        ) {
      if (((angband_term[xattr.cursor._4_4_] != (term *)0x0) &&
          (pvVar1 = angband_term[xattr.cursor._4_4_]->data, pvVar1 != (void *)0x0)) &&
         (*(long *)((long)pvVar1 + 0xe0) != 0)) {
        XChangeWindowAttributes(Metadpy->dpy,**(undefined8 **)((long)pvVar1 + 0xe0),2,&pixel);
      }
    }
  }
  return 0;
}

Assistant:

static errr Term_xtra_x11_react(void)
{
	int i;

	if (Metadpy->color) {
		XSetWindowAttributes xattr;

		/* Check the colors */
		for (i = 0; i < MAX_COLORS; i++) {
			if ((color_table_x11[i][0] != angband_color_table[i][0]) ||
			    (color_table_x11[i][1] != angband_color_table[i][1]) ||
			    (color_table_x11[i][2] != angband_color_table[i][2]) ||
			    (color_table_x11[i][3] != angband_color_table[i][3])) {
				Pixell pixel;

				/* Save new values */
				color_table_x11[i][0] = angband_color_table[i][0];
				color_table_x11[i][1] = angband_color_table[i][1];
				color_table_x11[i][2] = angband_color_table[i][2];
				color_table_x11[i][3] = angband_color_table[i][3];

				/* Create pixel */
				pixel = create_pixel(Metadpy->dpy,
						     color_table_x11[i][1],
						     color_table_x11[i][2],
						     color_table_x11[i][3]);

				/* Change the foreground */
				Infoclr_set(clr[i]);
				Infoclr_change_fg(pixel);

				if (i == COLOUR_DARK) {
					int j;

					Metadpy->bg = pixel;
					/* Change the background */
					for (j = 0; j < MAX_COLORS; ++j) {
						Infoclr_set(clr[j]);
						Infoclr_change_bg(pixel);
					}
				} else if (i == COLOUR_WHITE) {
					Metadpy->fg = pixel;
				} else if (i == COLOUR_SHADE) {
					int j;

					/*
					 * For all colors, modify the variant
					 * that uses COLOUR_SHADE as the
					 * background.
					 */
					for (j = BG_DARK * MAX_COLORS;
							j < (BG_DARK + 1)
							* MAX_COLORS; ++j) {
						Infoclr_set(clr[j]);
						Infoclr_change_bg(pixel);
					}
				}

				/*
				 * Also modify the variants of this color
				 * which uses the color itself as the
				 * background or COLOUR_SHADE as the background.
				 */
				Infoclr_set(clr[i + BG_SAME * MAX_COLORS]);
				Infoclr_change_fg(pixel);
				Infoclr_change_bg(pixel);
				Infoclr_set(clr[i + BG_DARK * MAX_COLORS]);
				Infoclr_change_fg(pixel);
			}
		}

		xattr.background_pixel = Metadpy->bg;
		for (i = 0; i < ANGBAND_TERM_MAX; ++i) {
			term_data *td;

			if (!angband_term[i]) continue;
			td = (term_data*)(angband_term[i]->data);
			if (!td || !td->win) continue;
			XChangeWindowAttributes(Metadpy->dpy, td->win->win,
				CWBackPixel, &xattr);
		}
	}

	/* Success */
	return (0);
}